

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
RepeatedPtrFieldInsertionIteratorsTest_UnsafeArenaAllocatedRepeatedPtrFieldWithStringIntData_Test::
~RepeatedPtrFieldInsertionIteratorsTest_UnsafeArenaAllocatedRepeatedPtrFieldWithStringIntData_Test
          (RepeatedPtrFieldInsertionIteratorsTest_UnsafeArenaAllocatedRepeatedPtrFieldWithStringIntData_Test
           *this)

{
  RepeatedPtrFieldInsertionIteratorsTest::~RepeatedPtrFieldInsertionIteratorsTest
            (&this->super_RepeatedPtrFieldInsertionIteratorsTest);
  operator_delete(this,0x3c0);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldInsertionIteratorsTest,
       UnsafeArenaAllocatedRepeatedPtrFieldWithStringIntData) {
  std::vector<Nested*> data;
  Arena arena;
  auto* goldenproto = Arena::Create<TestAllTypes>(&arena);
  for (int i = 0; i < 10; ++i) {
    auto* new_data = goldenproto->add_repeated_nested_message();
    new_data->set_bb(i);
    data.push_back(new_data);
  }
  auto* testproto = Arena::Create<TestAllTypes>(&arena);
  std::copy(data.begin(), data.end(),
            UnsafeArenaAllocatedRepeatedPtrFieldBackInserter(
                testproto->mutable_repeated_nested_message()));
  EXPECT_EQ(testproto->DebugString(), goldenproto->DebugString());
}